

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

Level * LoadLevel(char *name,int radius)

{
  Edge **ppEVar1;
  Vertex *pVVar2;
  Vertex *pVVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ALLEGRO_FILE *pAVar7;
  Level *NewLev;
  Vertex *pVVar8;
  Edge *pEVar9;
  ALLEGRO_BITMAP *pAVar10;
  ALLEGRO_SAMPLE *pAVar11;
  LevelState *pLVar12;
  Edge *pEVar13;
  Edge **ppEVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  ErrorText._0_4_ = ErrorText._0_4_ & 0xffffff00;
  Error = 0;
  Lines = 1;
  pAVar7 = (ALLEGRO_FILE *)al_fopen(name,"r");
  input = pAVar7;
  if (pAVar7 == (ALLEGRO_FILE *)0x0) {
    snprintf(ErrorText,0x400,"Unable to load %s",name);
    return (Level *)0x0;
  }
  NewLev = NewLevel();
  LoadMaterials(NewLev);
  if (((Error == 0) && (LoadVertices(NewLev), Error == 0)) &&
     (LoadTriangles(NewLev,radius), Error == 0)) {
    ppEVar1 = &NewLev->AllEdges;
    dVar21 = (double)radius;
    do {
      for (pVVar8 = NewLev->AllVerts; pVVar8 != (Vertex *)0x0; pVVar8 = pVVar8->Next) {
        pEVar9 = pVVar8->Edges[0];
        pEVar13 = pVVar8->Edges[1];
        if (pEVar13 == (Edge *)0x0) {
          if (pEVar9 != (Edge *)0x0) {
            dVar17 = dVar21;
            if (pEVar9->EndPoints[0] != pVVar8) {
              dVar17 = -dVar21;
            }
            pVVar8->Normal[0] = pEVar9->b * dVar17 + pEVar9->a * dVar21 + pVVar8->Pos[0];
            dVar17 = (pEVar9->b * dVar21 + pVVar8->Pos[1]) - dVar17 * pEVar9->a;
            goto LAB_0010cdfa;
          }
        }
        else {
          pVVar2 = pEVar9->EndPoints[0];
          dVar17 = pEVar9->a;
          pVVar3 = pEVar9->EndPoints[1];
          dVar18 = dVar17 * dVar21 + pVVar2->Pos[0];
          dVar19 = pEVar13->c +
                   pEVar13->a * dVar18 + pEVar13->b * (pEVar9->b * dVar21 + pVVar2->Pos[1]);
          dVar20 = dVar19 - (pEVar13->c +
                            pEVar13->a * (dVar17 * dVar21 + pVVar3->Pos[0]) +
                            pEVar13->b * (pEVar9->b * dVar21 + pVVar3->Pos[1]));
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            dVar19 = dVar19 / dVar20;
            pVVar8->Normal[0] = (pVVar3->Pos[0] - pVVar2->Pos[0]) * dVar19 + dVar18;
            dVar17 = (pVVar3->Pos[1] - pVVar2->Pos[1]) * dVar19 +
                     pEVar9->b * dVar21 + pVVar2->Pos[1];
          }
          else {
            pVVar8->Normal[0] = dVar17 * dVar21 + pVVar8->Pos[0];
            dVar17 = pEVar9->b * dVar21 + pVVar8->Pos[1];
          }
LAB_0010cdfa:
          pVVar8->Normal[1] = dVar17;
        }
      }
      pEVar9 = *ppEVar1;
      if (pEVar9 == (Edge *)0x0) goto LAB_0010cfe0;
      bVar4 = false;
      ppEVar14 = ppEVar1;
      do {
        dVar17 = pEVar9->a;
        dVar18 = pEVar9->b;
        iVar6 = GetNormal(pEVar9,pEVar9->EndPoints[0]->Normal,pEVar9->EndPoints[1]->Normal);
        pEVar13 = *ppEVar14;
        if ((iVar6 != 0) || (bVar5 = bVar4, dVar17 * pEVar13->a + dVar18 * pEVar13->b < 0.0)) {
          pEVar9 = pEVar13->EndPoints[1]->Edges[0];
          if (pEVar9 == pEVar13) {
            pEVar9 = pEVar13->EndPoints[1]->Edges[1];
          }
          pVVar8 = pEVar13->EndPoints[0];
          if (pVVar8->Edges[0] == pEVar13) {
            if (pEVar9 == (Edge *)0x0) {
              pVVar8->Edges[0] = pVVar8->Edges[1];
              (*ppEVar14)->EndPoints[0]->Edges[1] = (Edge *)0x0;
            }
            else {
              pVVar8->Edges[0] = pEVar9;
            }
          }
          else {
            pVVar8->Edges[1] = pEVar9;
          }
          pEVar9->EndPoints[pEVar9->EndPoints[0] != (*ppEVar14)->EndPoints[1]] =
               (*ppEVar14)->EndPoints[0];
          (*ppEVar14)->EndPoints[1]->Edges[1] = (Edge *)0x0;
          (*ppEVar14)->EndPoints[1]->Edges[0] = (Edge *)0x0;
          pEVar9 = *ppEVar14;
          *ppEVar14 = pEVar9->Next;
          free(pEVar9);
          pEVar13 = *ppEVar14;
          bVar4 = true;
          bVar5 = true;
          if (pEVar13 == (Edge *)0x0) break;
        }
        bVar4 = bVar5;
        pEVar9 = pEVar13->Next;
        ppEVar14 = &pEVar13->Next;
      } while (pEVar9 != (Edge *)0x0);
    } while (bVar4);
    for (pEVar9 = *ppEVar1; pEVar9 != (Edge *)0x0; pEVar9 = pEVar9->Next) {
      pVVar8 = pEVar9->EndPoints[0];
      pVVar2 = pEVar9->EndPoints[1];
      dVar21 = pVVar8->Normal[0];
      uVar15 = SUB84(dVar21,0);
      uVar16 = (undefined4)((ulong)dVar21 >> 0x20);
      dVar17 = pVVar2->Normal[0];
      if (dVar17 <= dVar21) {
        uVar15 = SUB84(dVar17,0);
        uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
      }
      (pEVar9->Bounder).TL.Pos[0] = (double)CONCAT44(uVar16,uVar15) + -0.05000000074505806;
      dVar21 = pVVar8->Normal[1];
      uVar15 = SUB84(dVar21,0);
      uVar16 = (undefined4)((ulong)dVar21 >> 0x20);
      dVar17 = pVVar2->Normal[1];
      if (dVar17 <= dVar21) {
        uVar15 = SUB84(dVar17,0);
        uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
      }
      (pEVar9->Bounder).TL.Pos[1] = (double)CONCAT44(uVar16,uVar15) + -0.05000000074505806;
      dVar21 = pVVar8->Normal[0];
      uVar15 = SUB84(dVar21,0);
      uVar16 = (undefined4)((ulong)dVar21 >> 0x20);
      dVar17 = pVVar2->Normal[0];
      if (dVar21 <= dVar17) {
        uVar15 = SUB84(dVar17,0);
        uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
      }
      (pEVar9->Bounder).BR.Pos[0] = (double)CONCAT44(uVar16,uVar15) + 0.05000000074505806;
      dVar21 = pVVar8->Normal[1];
      uVar15 = SUB84(dVar21,0);
      uVar16 = (undefined4)((ulong)dVar21 >> 0x20);
      dVar17 = pVVar2->Normal[1];
      if (dVar21 <= dVar17) {
        uVar15 = SUB84(dVar17,0);
        uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
      }
      (pEVar9->Bounder).BR.Pos[1] = (double)CONCAT44(uVar16,uVar15) + 0.05000000074505806;
      AddEdge(NewLev,pEVar9);
    }
LAB_0010cfe0:
    LoadObjectTypes(NewLev,radius);
    if (Error == 0) {
      pAVar10 = ObtainBitmap("dooropen");
      NewLev->DoorOpen = pAVar10;
      if (pAVar10 == (ALLEGRO_BITMAP *)0x0) {
        builtin_strncpy(ErrorText + 0x10," dooropen sprite",0x10);
LAB_0010d130:
        builtin_strncpy(ErrorText,"Unable to obtain",0x10);
        ErrorText[0x20] = '\0';
      }
      else {
        pAVar10 = ObtainBitmap("doorshut");
        NewLev->DoorShut = pAVar10;
        if (pAVar10 == (ALLEGRO_BITMAP *)0x0) {
          builtin_strncpy(ErrorText + 0x10," doorshut sprite",0x10);
          goto LAB_0010d130;
        }
        (NewLev->Door).Image = pAVar10;
        pAVar11 = ObtainSample("dooropen");
        (NewLev->Door).CollectNoise = pAVar11;
        (NewLev->Door).Radius = radius + 0xe;
        NewLev->TotalObjects = 0;
        LoadObjects(NewLev);
        if (Error == 0) {
          AddTriangles(NewLev);
          ScaleAndAddObjects(NewLev);
          SplitTree(&NewLev->DisplayTree);
          OrderTree(&NewLev->DisplayTree,0);
          OrderTree(&NewLev->DisplayTree,1);
          OrderTree(&NewLev->CollisionTree,0);
          LoadStats(NewLev);
          if (Error == 0) {
            pLVar12 = BorrowState(NewLev);
            NewLev->InitialState = pLVar12;
            return NewLev;
          }
        }
      }
      al_fclose(pAVar7);
      goto LAB_0010d008;
    }
  }
  al_fclose(pAVar7);
  if (NewLev == (Level *)0x0) {
    return (Level *)0x0;
  }
LAB_0010d008:
  FreeLevel(NewLev);
  return (Level *)0x0;
}

Assistant:

struct Level *LoadLevel(char const *name, int radius)
{
   ALLEGRO_FILE *file;
   struct Level *NewLev = NULL;

   ErrorText[0] = '\0';         /* set ErrorText to be a zero length string
                                   so that it will be obvious later if anything has set the error flag
                                   but not produced a verbose explanation of the error */
   Error = 0;                   /* reset error flag as no error has occurred yet */
   Lines = 1;                   /* first line is line 1 */

   /* attempt to open named level file */
   file = al_fopen(name, "r");
   input = file;

   if (!input) {
      snprintf(ErrorText, sizeof(ErrorText), "Unable to load %s", name);
      goto error;
   }

   /* allocate and initially set up new level structure */
   NewLev = NewLevel();

   /* load materials, vertices & triangles in that order */
   LoadMaterials(NewLev);
   if (Error) {
      goto error;
   }
   LoadVertices(NewLev);
   if (Error) {
      goto error;
   }
   LoadTriangles(NewLev, radius);
   if (Error) {
      goto error;
   }

   /* do a repeat 'fix' of vertices and fix of edges until we have
      no edge errors - see algorithm descriptions elsewhere in this
      file */
   do
      FixVerts(NewLev, radius);
   while (FixEdges(NewLev, radius));

   /* now that edges are al_fixed, add them to the collision tree */
   AddEdges(NewLev);

   /* load ordinary object types */
   LoadObjectTypes(NewLev, radius);
   if (Error) {
      goto error;
   }

   /* load special case object: door */
   if (!(NewLev->DoorOpen = ObtainBitmap("dooropen"))) {
      snprintf(ErrorText, sizeof(ErrorText),
                "Unable to obtain dooropen sprite");
      goto error;
   }
   if (!(NewLev->DoorShut = ObtainBitmap("doorshut"))) {
      snprintf(ErrorText, sizeof(ErrorText),
                "Unable to obtain doorshut sprite");
      goto error;
   }
   NewLev->Door.Image = NewLev->DoorShut;
   NewLev->Door.CollectNoise = ObtainSample("dooropen");
   NewLev->Door.Radius = 14 + radius;

   /* load objects */
   NewLev->TotalObjects = 0;
   LoadObjects(NewLev);
   if (Error) {
      goto error;
   }

   /* complete display tree additions */
   AddTriangles(NewLev);
   ScaleAndAddObjects(NewLev);

   /* order things for drawing */
   SplitTree(&NewLev->DisplayTree);
   OrderTree(&NewLev->DisplayTree, false);
   OrderTree(&NewLev->DisplayTree, true);
   OrderTree(&NewLev->CollisionTree, false);

   /* load static level stuff - player start pos, etc */
   LoadStats(NewLev);
   if (Error) {
      goto error;
   }

   /* make a copy of the initial state */
   NewLev->InitialState = BorrowState(NewLev);

   /* return level */
   return NewLev;

error:
   /* close input file */
   if (file)
      al_fclose(file);

   if (NewLev)
      FreeLevel(NewLev);

   return NULL;
}